

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_readwrite(connectdata *conn,Curl_easy *data,_Bool *done,_Bool *comeback)

{
  long *plVar1;
  int *piVar2;
  char **ppcVar3;
  byte bVar4;
  char cVar5;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var6;
  Curl_handler *pCVar7;
  contenc_writer *writer;
  void *pvVar8;
  long lVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  _Bool _Var18;
  ushort uVar19;
  CURLcode CVar20;
  CHUNKcode code;
  uint uVar21;
  anon_enum_32 aVar22;
  int iVar23;
  size_t sVar24;
  char *pcVar25;
  timediff_t tVar26;
  size_t sVar27;
  size_t sVar28;
  size_t sVar29;
  curl_socket_t writefd;
  uint uVar30;
  char *pcVar31;
  long lVar32;
  curl_socket_t readfd0;
  curl_off_t cVar33;
  uint uVar34;
  uint uVar35;
  bool bVar36;
  curltime cVar37;
  curltime older;
  curltime older_00;
  curltime newer;
  curltime newer_00;
  ssize_t bytes_written;
  _Bool readmore;
  _Bool local_59;
  size_t local_58;
  _Bool local_50;
  undefined7 uStack_4f;
  _Bool *local_48;
  int local_3c;
  _Bool *local_38;
  
  uVar34 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar21 = (data->req).keepon;
  writefd = -1;
  readfd0 = -1;
  if ((uVar21 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar21 & 0x2a) == 2) {
    writefd = conn->writesockfd;
  }
  uVar34 = uVar34 | (conn->data->state).drain != 0;
  if (uVar34 == 0) {
    uVar34 = Curl_socket_check(readfd0,-1,writefd,0);
  }
  if (uVar34 == 4) {
    Curl_failf(data,"select/poll returned error");
    return CURLE_SEND_ERROR;
  }
  uVar21 = (data->req).keepon;
  uVar30 = 0;
  local_38 = comeback;
  if (((uVar21 & 1) != 0) &&
     (((uVar34 & 1) != 0 || (uVar30 = 0, ((conn->bits).field_0x6 & 0x40) != 0)))) {
    local_50 = false;
    *done = false;
    *comeback = false;
    iVar23 = 100;
    uVar30 = 0;
    sVar28 = 0;
    local_48 = done;
    do {
      sVar29 = (data->set).buffer_size;
      lVar32 = (data->req).size;
      if (((lVar32 != -1) && (((data->req).field_0x570 & 1) == 0)) &&
         (sVar24 = lVar32 - (data->req).bytecount, (long)sVar24 < (long)sVar29)) {
        sVar29 = sVar24;
      }
      local_3c = iVar23;
      if (sVar29 != 0) {
        CVar20 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar29,(ssize_t *)&local_58);
        if (CVar20 == CURLE_OK) goto LAB_004c5e9c;
        if (CVar20 != CURLE_AGAIN) {
          return CVar20;
        }
LAB_004c6459:
        if (0 < local_3c) goto LAB_004c6473;
        break;
      }
      local_58 = 0;
LAB_004c5e9c:
      if ((((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) &&
         (Curl_pgrsTime(data,TIMER_STARTTRANSFER), (data->req).exp100 != EXP100_SEND_DATA)) {
        cVar37 = Curl_now();
        (data->req).start100.tv_sec = cVar37.tv_sec;
        (data->req).start100.tv_usec = cVar37.tv_usec;
      }
      if (local_58 == 0) {
        bVar36 = (data->req).bodywrites == 0;
      }
      else {
        bVar36 = false;
      }
      if ((long)local_58 < 1 && !bVar36) {
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
LAB_004c6454:
        uVar30 = 1;
        goto LAB_004c6459;
      }
      (data->req).buf[local_58] = '\0';
      (data->req).str = (data->req).buf;
      p_Var6 = conn->handler->readwrite;
      if (p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) {
        CVar20 = (*p_Var6)(data,conn,(ssize_t *)&local_58,&local_50);
        if (CVar20 != CURLE_OK) {
          return CVar20;
        }
        if (local_50 != false) goto LAB_004c6454;
      }
      if (((data->req).field_0x570 & 1) != 0) {
        local_59 = false;
        CVar20 = Curl_http_readwrite_headers(data,conn,(ssize_t *)&local_58,&local_59);
        if (CVar20 != CURLE_OK) {
          return CVar20;
        }
        p_Var6 = conn->handler->readwrite;
        if (((p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0)
            && ((data->req).maxdownload < 1)) && (0 < (long)local_58)) {
          CVar20 = (*p_Var6)(data,conn,(ssize_t *)&local_58,&local_50);
          if (CVar20 != CURLE_OK) {
            return CVar20;
          }
          if (local_50 != false) goto LAB_004c6454;
        }
        if (local_59 == true) {
          if (0 < (long)local_58) {
            Curl_infof(data,"Excess found: excess = %zd url = %s (zero-length body)\n",local_58,
                       (data->state).up.path);
          }
          goto LAB_004c6454;
        }
      }
      if ((((data->req).str != (char *)0x0) &&
          (uVar19 = *(ushort *)&(data->req).field_0x570, (uVar19 & 1) == 0)) &&
         (0 < (long)local_58 || bVar36)) {
        if (((data->set).field_0x87b & 0x10) != 0) {
          Curl_conncontrol(conn,2);
          *local_48 = true;
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (((data->req).bodywrites == 0 && !bVar36) && ((conn->handler->protocol & 0x40003) != 0))
        {
          if ((data->req).newurl != (char *)0x0) {
            if (((conn->bits).field_0x4 & 1) != 0) {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
              *local_48 = true;
              uVar30 = 1;
              done = local_48;
              goto LAB_004c64af;
            }
            *(ushort *)&(data->req).field_0x570 = uVar19 | 8;
            Curl_infof(data,"Ignoring the response-body\n");
          }
          lVar32 = (data->state).resume_from;
          if (((lVar32 != 0) && (uVar19 = *(ushort *)&(data->req).field_0x570, (uVar19 & 2) == 0))
             && (((uVar19 & 8) == 0 && ((data->set).httpreq == HTTPREQ_GET)))) {
            if ((data->req).size != lVar32) {
              Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume.");
              return CURLE_RANGE_ERROR;
            }
            Curl_infof(data,"The entire document is already downloaded");
            uVar30 = 1;
            Curl_conncontrol(conn,1);
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            *local_48 = true;
            done = local_48;
            goto LAB_004c64af;
          }
          if ((((data->set).timecondition != CURL_TIMECOND_NONE) &&
              ((data->state).range == (char *)0x0)) &&
             (_Var18 = Curl_meets_timecondition(data,(data->req).timeofdoc), done = local_48,
             !_Var18)) {
            *local_48 = true;
            (data->info).httpcode = 0x130;
            Curl_infof(data,"Simulate a HTTP 304 response!\n");
            uVar30 = 1;
            Curl_conncontrol(conn,1);
            goto LAB_004c64af;
          }
        }
        plVar1 = &(data->req).bodywrites;
        *plVar1 = *plVar1 + 1;
        if ((((data->set).field_0x87b & 0x40) != 0) &&
           (((data->req).badheader == HEADER_NORMAL ||
            (Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(data->req).hbuflen),
            (data->req).badheader == HEADER_PARTHEADER)))) {
          Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,local_58);
        }
        if (((data->req).field_0x570 & 0x20) != 0) {
          code = Curl_httpchunk_read(conn,(data->req).str,local_58,(ssize_t *)&local_58);
          if (CHUNKE_OK < code) {
            if (code != CHUNKE_WRITE_ERROR) {
              pcVar25 = Curl_chunked_strerror(code);
              Curl_failf(data,"%s in chunked-encoding",pcVar25);
              return CURLE_RECV_ERROR;
            }
            Curl_failf(data,"Failed writing data");
            return CURLE_WRITE_ERROR;
          }
          if ((code == CHUNKE_STOP) &&
             (piVar2 = &(data->req).keepon, *(byte *)piVar2 = (byte)*piVar2 & 0xfe,
             (conn->chunk).dataleft != 0)) {
            Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n");
          }
        }
        if ((data->req).badheader == HEADER_PARTHEADER) {
          cVar33 = (data->req).bytecount;
          if (((data->req).field_0x570 & 8) == 0) {
            cVar33 = cVar33 + (data->req).hbuflen;
            (data->req).bytecount = cVar33;
          }
        }
        else {
          cVar33 = (data->req).bytecount;
        }
        lVar32 = (data->req).maxdownload;
        if (lVar32 != -1) {
          sVar29 = (local_58 + cVar33) - lVar32;
          if (lVar32 <= (long)(local_58 + cVar33)) {
            if ((sVar29 != 0) && (((data->req).field_0x570 & 8) == 0)) {
              Curl_infof(data,
                         "Excess found in a read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld\n"
                         ,sVar29,(data->req).size);
              lVar32 = (data->req).maxdownload;
              cVar33 = (data->req).bytecount;
            }
            local_58 = lVar32 - cVar33;
            if ((long)local_58 < 1) {
              local_58 = 0;
            }
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            sVar28 = sVar29;
          }
        }
        (data->req).bytecount = cVar33 + local_58;
        Curl_pgrsSetDownloadCounter(data,cVar33 + local_58);
        uVar19 = *(ushort *)&(data->req).field_0x570;
        if (((uVar19 & 0x20) == 0) &&
           (aVar22 = (data->req).badheader, (aVar22 != HEADER_NORMAL || local_58 != 0) || bVar36)) {
          if ((char)((uVar19 & 8) >> 3) == '\0' && aVar22 != HEADER_NORMAL) {
            sVar29 = (data->req).maxdownload;
            sVar24 = (data->req).hbuflen;
            sVar27 = sVar29;
            if ((long)sVar24 < (long)sVar29) {
              sVar27 = sVar24;
            }
            if (sVar29 == 0xffffffffffffffff) {
              sVar27 = sVar24;
            }
            CVar20 = Curl_client_write(conn,1,(data->state).headerbuff,sVar27);
            if (CVar20 != CURLE_OK) {
              return CVar20;
            }
            aVar22 = (data->req).badheader;
          }
          if (aVar22 < HEADER_ALLBAD) {
            if (((conn->data->set).field_0x87c & 0x80) == 0) {
              writer = (data->req).writer_stack;
              uVar19 = *(ushort *)&(data->req).field_0x570;
              if (writer == (contenc_writer *)0x0) goto LAB_004c6374;
              if ((uVar19 & 8) != 0) goto LAB_004c63a8;
              CVar20 = Curl_unencode_write(conn,writer,(data->req).str,local_58);
            }
            else {
              uVar19 = *(ushort *)&(data->req).field_0x570;
LAB_004c6374:
              if ((uVar19 & 8) != 0) goto LAB_004c63a8;
              CVar20 = Curl_client_write(conn,1,(data->req).str,local_58);
            }
            (data->req).badheader = HEADER_NORMAL;
            if (CVar20 != CURLE_OK) {
              return CVar20;
            }
          }
          else {
LAB_004c63a8:
            (data->req).badheader = HEADER_NORMAL;
          }
        }
      }
      pCVar7 = conn->handler;
      p_Var6 = pCVar7->readwrite;
      if (((p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) &&
          (sVar28 != 0)) && (((conn->bits).field_0x6 & 0x40) == 0)) {
        pcVar25 = (data->req).str + local_58;
        (data->req).str = pcVar25;
        pcVar31 = (data->req).buf + (data->set).buffer_size;
        local_58 = (long)pcVar31 - (long)pcVar25;
        if (pcVar25 + sVar28 <= pcVar31) {
          local_58 = sVar28;
        }
        CVar20 = (*p_Var6)(data,conn,(ssize_t *)&local_58,&local_50);
        if (CVar20 != CURLE_OK) {
          return CVar20;
        }
        uVar30 = 1;
        if (local_50 == true) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 | 1;
        }
        goto LAB_004c6459;
      }
      uVar21 = (data->req).keepon;
      if (bVar36) {
        uVar21 = uVar21 & 0xfffffffe;
        (data->req).keepon = uVar21;
      }
      uVar30 = 1;
      if (((uVar21 & 0x10) != 0) ||
         (((pCVar7->protocol & 0x30) == 0 && (_Var18 = Curl_ssl_data_pending(conn,0), !_Var18))))
      goto LAB_004c6459;
      uVar30 = 1;
      iVar23 = local_3c + -1;
    } while (local_3c != 0);
    conn->cselect_bits = 1;
    *local_38 = true;
LAB_004c6473:
    done = local_48;
    if ((((data->req).keepon & 3U) == 2) && (((conn->bits).field_0x4 & 1) != 0)) {
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
    }
LAB_004c64af:
    if (*done != false) {
      return CURLE_OK;
    }
    uVar21 = (data->req).keepon;
  }
  uVar35 = uVar30;
  if ((uVar34 & uVar21 & 2) == 0) goto LAB_004c6821;
  if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
  }
  uVar35 = uVar30 | 2;
  sVar28 = (data->req).upload_present;
  if (sVar28 == 0) {
    pcVar25 = (data->state).ulbuf;
    if (pcVar25 == (char *)0x0) {
      pcVar25 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size);
      (data->state).ulbuf = pcVar25;
      if (pcVar25 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    (data->req).upload_fromhere = pcVar25;
    if (((data->req).field_0x570 & 4) == 0) {
      pvVar8 = (data->req).protop;
      if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar8 + 0x208) == 2)) {
        (data->req).exp100 = EXP100_AWAITING_CONTINUE;
        piVar2 = &(data->req).keepon;
        *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
        cVar37 = Curl_now();
        (data->req).start100.tv_sec = cVar37.tv_sec;
        (data->req).start100.tv_usec = cVar37.tv_usec;
        Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
        uVar35 = uVar30;
        goto LAB_004c6821;
      }
      if ((conn->handler->protocol & 0x40003) == 0) {
        bVar36 = false;
      }
      else {
        bVar36 = *(int *)((long)pvVar8 + 0x208) == 1;
      }
      CVar20 = Curl_fillreadbuffer(conn,(data->set).upload_buffer_size,(size_t *)&local_50);
      if (CVar20 != CURLE_OK) {
        return CVar20;
      }
      sVar28 = CONCAT71(uStack_4f,local_50);
      if (sVar28 == 0) goto LAB_004c67e9;
      if (0 < (long)sVar28) {
        (data->req).upload_present = sVar28;
        if ((!bVar36) && ((*(ushort *)&(data->set).field_0x878 & 0x840) != 0)) {
          if ((data->state).scratch == (char *)0x0) {
            pcVar25 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size * 2);
            (data->state).scratch = pcVar25;
            if (pcVar25 == (char *)0x0) {
              Curl_failf(data,"Failed to alloc scratch buffer!");
              return CURLE_OUT_OF_MEMORY;
            }
          }
          sVar24 = 0;
          sVar29 = 0;
          do {
            cVar5 = (data->req).upload_fromhere[sVar24];
            pcVar25 = (data->state).scratch;
            if (cVar5 == '\n') {
              sVar27 = sVar29 + 1;
              pcVar25[sVar29] = '\r';
              (data->state).scratch[sVar29 + 1] = '\n';
              sVar29 = sVar27;
              if ((((data->set).field_0x878 & 0x40) == 0) &&
                 (lVar32 = (data->state).infilesize, lVar32 != -1)) {
                (data->state).infilesize = lVar32 + 1;
              }
            }
            else {
              pcVar25[sVar29] = cVar5;
            }
            sVar24 = sVar24 + 1;
            sVar29 = sVar29 + 1;
          } while (sVar28 != sVar24);
          if (sVar29 == sVar28) {
            sVar28 = (data->req).upload_present;
          }
          else {
            (data->req).upload_fromhere = (data->state).scratch;
            (data->req).upload_present = sVar29;
            sVar28 = sVar29;
          }
        }
        goto LAB_004c6507;
      }
      uVar34 = (data->req).keepon;
    }
    else {
LAB_004c67e9:
      uVar34 = (data->req).keepon;
      if ((uVar34 & 0x20) != 0) goto LAB_004c6821;
    }
    (data->req).keepon = uVar34 & 0xfffffffd;
    bVar4 = (conn->bits).field_0x6;
  }
  else {
LAB_004c6507:
    CVar20 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,sVar28,
                        (ssize_t *)&local_58);
    if (CVar20 != CURLE_OK) {
      return CVar20;
    }
    if (((data->set).field_0x87b & 0x40) != 0) {
      Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,local_58);
    }
    lVar32 = (data->req).writebytecount + local_58;
    (data->req).writebytecount = lVar32;
    Curl_pgrsSetUploadCounter(data,lVar32);
    uVar19 = *(ushort *)&(data->req).field_0x570;
    if (((uVar19 & 0x140) != 0x40) && ((data->req).writebytecount == (data->state).infilesize)) {
      *(ushort *)&(data->req).field_0x570 = uVar19 | 4;
      Curl_infof(data,"We are completely uploaded and fine\n");
    }
    lVar32 = (data->req).upload_present - local_58;
    if (lVar32 != 0) {
      (data->req).upload_present = lVar32;
      ppcVar3 = &(data->req).upload_fromhere;
      *ppcVar3 = *ppcVar3 + local_58;
      goto LAB_004c6821;
    }
    pcVar25 = (data->state).ulbuf;
    if (pcVar25 == (char *)0x0) {
      pcVar25 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size);
      (data->state).ulbuf = pcVar25;
      if (pcVar25 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    (data->req).upload_fromhere = pcVar25;
    (data->req).upload_present = 0;
    if (((data->req).field_0x570 & 4) == 0) goto LAB_004c6821;
    piVar2 = &(data->req).keepon;
    *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
    bVar4 = (conn->bits).field_0x6;
  }
  if (((bVar4 & 1) != 0) && (CVar20 = Curl_readrewind(conn), CVar20 != CURLE_OK)) {
    return CVar20;
  }
LAB_004c6821:
  cVar37 = Curl_now();
  (data->req).now.tv_sec = cVar37.tv_sec;
  (data->req).now.tv_usec = cVar37.tv_usec;
  if (((uVar35 == 0) && ((data->req).exp100 == EXP100_AWAITING_CONTINUE)) &&
     (uVar10 = (data->req).start100.tv_sec, uVar11 = (data->req).start100.tv_usec,
     older.tv_usec = uVar11, older.tv_sec = uVar10, older._12_4_ = 0, newer._12_4_ = 0,
     newer.tv_sec = SUB128(cVar37._0_12_,0), newer.tv_usec = SUB124(cVar37._0_12_,8),
     tVar26 = Curl_timediff(newer,older), (data->set).expect_100_timeout <= tVar26)) {
    (data->req).exp100 = EXP100_SEND_DATA;
    piVar2 = &(data->req).keepon;
    *(byte *)piVar2 = (byte)*piVar2 | 2;
    Curl_expire_done(data,EXPIRE_100_TIMEOUT);
    Curl_infof(data,"Done waiting for 100-continue\n");
  }
  iVar23 = Curl_pgrsUpdate(conn);
  if (iVar23 == 0) {
    uVar12 = (data->req).now.tv_sec;
    uVar13 = (data->req).now.tv_usec;
    cVar37.tv_usec = uVar13;
    cVar37.tv_sec = uVar12;
    cVar37._12_4_ = 0;
    CVar20 = Curl_speedcheck(data,cVar37);
    if (CVar20 != CURLE_OK) {
      return CVar20;
    }
    if ((data->req).keepon == 0) {
      if (((data->set).field_0x87b & 0x10) == 0) {
        lVar32 = (data->req).size;
        if (((lVar32 != -1) && (lVar9 = (data->req).bytecount, lVar32 != lVar9)) &&
           ((lVar9 != lVar32 + (data->state).crlf_conversions && ((data->req).newurl == (char *)0x0)
            ))) {
          Curl_failf(data,"transfer closed with %ld bytes remaining to read");
          return CURLE_PARTIAL_FILE;
        }
        if ((((data->req).field_0x570 & 0x20) != 0) && ((conn->chunk).state != CHUNK_STOP)) {
          Curl_failf(data,"transfer closed with outstanding read data remaining");
          return CURLE_PARTIAL_FILE;
        }
      }
      iVar23 = Curl_pgrsUpdate(conn);
      if (iVar23 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      tVar26 = Curl_timeleft(data,&(data->req).now,false);
      if (tVar26 < 0) {
        lVar32 = (data->req).size;
        uVar16 = (data->req).now.tv_sec;
        uVar17 = (data->req).now.tv_usec;
        newer_00.tv_usec = uVar17;
        newer_00.tv_sec = uVar16;
        uVar14 = (data->progress).t_startsingle.tv_sec;
        uVar15 = (data->progress).t_startsingle.tv_usec;
        older_00.tv_usec = uVar15;
        older_00.tv_sec = uVar14;
        older_00._12_4_ = 0;
        newer_00._12_4_ = 0;
        tVar26 = Curl_timediff(newer_00,older_00);
        cVar33 = (data->req).bytecount;
        if (lVar32 == -1) {
          Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",
                     tVar26,cVar33);
        }
        else {
          Curl_failf(data,
                     "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                     ,tVar26,cVar33,(data->req).size);
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    *done = ((data->req).keepon & 0x33) == 0;
    return CURLE_OK;
  }
  return CURLE_ABORTED_BY_CALLBACK;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct Curl_easy *data,
                        bool *done,
                        bool *comeback)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat = 0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_check(fd_read, CURL_SOCKET_BAD, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done, comeback);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_now();
  if(didwhat) {
    ;
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      timediff_t ms = Curl_timediff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        Curl_expire_done(data, EXPIRE_100_TIMEOUT);
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
              " milliseconds with %" CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
              " milliseconds with %" CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !k->newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    if(!(data->set.opt_no_body) && k->chunk &&
       (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}